

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O2

void __thiscall
cappuccino::
utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
::do_update(utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
            *this,keyed_iterator keyed_position,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
           time_point expire_time)

{
  utlru_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)0>
  *this_00;
  duration *pdVar1;
  long lVar2;
  long lVar3;
  uint unaff_EBX;
  __off64_t *in_R8;
  size_t in_R9;
  
  lVar2 = *(long *)(this + 0x38);
  lVar3 = *(long *)((long)keyed_position.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                          ._M_cur + 0x10) * 0x40;
  pdVar1 = (duration *)(lVar2 + lVar3);
  pdVar1->__r = (rep)expire_time.__d.__r;
  std::__cxx11::string::operator=((string *)(pdVar1 + 4),(string *)value);
  this_00 = this + 0xa0;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,(int)this_00,
             (__off64_t *)this_00,(int)pdVar1[3].__r,in_R8,in_R9,unaff_EBX);
  do_access(this,(element *)(lVar2 + lVar3));
  return;
}

Assistant:

auto do_update(keyed_iterator keyed_position, value_type&& value, std::chrono::steady_clock::time_point expire_time)
        -> void
    {
        size_t element_idx = keyed_position->second;

        element& e      = m_elements[element_idx];
        e.m_expire_time = expire_time;
        e.m_value       = std::move(value);

        // push to the end of the ttl list
        m_ttl_list.splice(m_ttl_list.end(), m_ttl_list, e.m_ttl_position);

        do_access(e);
    }